

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_12ce2fb::HandleVariableMode
               (cmExecutionStatus *status,string *name,OutType infoType,string *variable,
               string *propertyName)

{
  size_type sVar1;
  cmMakefile *this;
  cmValue value;
  long *local_48 [2];
  long local_38 [2];
  
  sVar1 = name->_M_string_length;
  if (sVar1 == 0) {
    this = status->Makefile;
    value = cmMakefile::GetDefinition(this,propertyName);
    StoreResult<cmValue>(infoType,this,variable,value);
  }
  else {
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"given name for VARIABLE scope.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return sVar1 == 0;
}

Assistant:

bool HandleVariableMode(cmExecutionStatus& status, const std::string& name,
                        OutType infoType, const std::string& variable,
                        const std::string& propertyName)
{
  if (!name.empty()) {
    status.SetError("given name for VARIABLE scope.");
    return false;
  }

  return StoreResult(infoType, status.GetMakefile(), variable,
                     status.GetMakefile().GetDefinition(propertyName));
}